

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
fasttext::Model::findKBest
          (Model *this,int32_t k,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden,Vector *output)

{
  pointer *pppVar1;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __first;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last;
  pair<float,_int> in_RAX;
  real *prVar2;
  undefined4 extraout_var;
  long i;
  long lVar3;
  double dVar4;
  pair<float,_int> local_38;
  
  local_38 = in_RAX;
  computeOutputSoftmax(this,hidden,output);
  lVar3 = 0;
  i = 0;
  do {
    if (this->osz_ <= i) {
      return;
    }
    if ((long)(heap->
              super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(heap->
              super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start >> 3 == (long)k) {
      prVar2 = Vector::operator[](output,i);
      dVar4 = utils::log((double)(ulong)(uint)*prVar2);
      if (((heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start)->first <= SUB84(dVar4,0)) goto LAB_0011f90f;
    }
    else {
LAB_0011f90f:
      prVar2 = Vector::operator[](output,i);
      dVar4 = utils::log((double)(ulong)(uint)*prVar2);
      local_38 = (pair<float,_int>)(CONCAT44(extraout_var,SUB84(dVar4,0)) + lVar3);
      std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
      emplace_back<std::pair<float,int>>
                ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,&local_38
                );
      std::
      push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                ((heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start,
                 (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish,comparePairs);
      __first._M_current =
           (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)(long)k < (ulong)((long)__last._M_current - (long)__first._M_current >> 3)) {
        std::
        pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                  (__first,__last,comparePairs);
        pppVar1 = &(heap->
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + -1;
      }
    }
    i = i + 1;
    lVar3 = lVar3 + 0x100000000;
  } while( true );
}

Assistant:

void Model::findKBest(int32_t k, std::vector<std::pair<real, int32_t>>& heap,
                      Vector& hidden, Vector& output) const {
  computeOutputSoftmax(hidden, output);
  for (int32_t i = 0; i < osz_; i++) {
    if (heap.size() == k && utils::log(output[i]) < heap.front().first) {
      continue;
    }
    heap.push_back(std::make_pair(utils::log(output[i]), i));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
  }
}